

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

bool __thiscall
ON_V4V5_MeshNgonUserData::Read(ON_V4V5_MeshNgonUserData *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  ON_V4V5_MeshNgonList *pOVar2;
  ON_V4V5_MeshNgon *pOVar3;
  ON_V4V5_MeshNgon *ngon;
  int local_40;
  int N;
  int i;
  ON__INT32 local_30;
  bool local_29;
  int count;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_V4V5_MeshNgonUserData *this_local;
  
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  if (this->m_ngon_list != (ON_V4V5_MeshNgonList *)0x0) {
    pOVar2 = this->m_ngon_list;
    if (pOVar2 != (ON_V4V5_MeshNgonList *)0x0) {
      ON_V4V5_MeshNgonList::~ON_V4V5_MeshNgonList(pOVar2);
      operator_delete(pOVar2,0x18);
    }
    this->m_ngon_list = (ON_V4V5_MeshNgonList *)0x0;
  }
  iStack_24 = 0;
  count = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (_minor_version,0x40008000,&stack0xffffffffffffffdc,&count);
  if (bVar1) {
    local_29 = iStack_24 == 1;
    if (local_29) {
      local_30 = 0;
      local_29 = ON_BinaryArchive::ReadInt(_minor_version,&local_30);
      if ((0 < local_30) && (local_29)) {
        pOVar2 = (ON_V4V5_MeshNgonList *)operator_new(0x18);
        ON_V4V5_MeshNgonList::ON_V4V5_MeshNgonList(pOVar2);
        this->m_ngon_list = pOVar2;
        if (this->m_ngon_list != (ON_V4V5_MeshNgonList *)0x0) {
          ON_V4V5_MeshNgonList::V4V5_ReserveNgonCapacity(this->m_ngon_list,local_30);
          for (local_40 = 0; local_40 < local_30; local_40 = local_40 + 1) {
            ngon._4_4_ = 0;
            local_29 = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)((long)&ngon + 4));
            if (!local_29) break;
            if (0 < ngon._4_4_) {
              pOVar3 = ON_V4V5_MeshNgonList::V4V5_AddNgon(this->m_ngon_list,ngon._4_4_);
              if (((pOVar3 == (ON_V4V5_MeshNgon *)0x0) ||
                  (local_29 = ON_BinaryArchive::ReadInt(_minor_version,(long)ngon._4_4_,pOVar3->vi),
                  !local_29)) ||
                 (local_29 = ON_BinaryArchive::ReadInt(_minor_version,(long)ngon._4_4_,pOVar3->fi),
                 !local_29)) break;
              pOVar3->N = ngon._4_4_;
            }
          }
          if ((((local_29 & 1U) != 0) && (0 < count)) &&
             (local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_mesh_F_count), local_29))
          {
            local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_mesh_V_count);
          }
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      local_29 = false;
    }
    this_local._7_1_ = (bool)(local_29 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_V4V5_MeshNgonUserData::Read(ON_BinaryArchive& archive)
{
  if ( 0 != m_ngon_list )
  {
    delete m_ngon_list;
    m_ngon_list = 0;
  }
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;
  for (;;)
  {
    rc = (1 == major_version);
    if (!rc)
      break;
    int count = 0;
    rc = archive.ReadInt(&count);
    if (count <= 0 || !rc)
      break;

    m_ngon_list = new ON_V4V5_MeshNgonList();
    if ( 0 == m_ngon_list )
      break;

    m_ngon_list->V4V5_ReserveNgonCapacity(count);

    for ( int i = 0; i < count; i++ )
    {
      int N = 0;
      rc = archive.ReadInt(&N);
      if (!rc)
        break;
      if ( N <= 0 )
        continue;
      class ON_V4V5_MeshNgon* ngon = m_ngon_list->V4V5_AddNgon(N);
      if ( 0 == ngon )
        break;

      rc = archive.ReadInt(N,ngon->vi);
      if (!rc)
        break;
      rc = archive.ReadInt(N,ngon->fi);
      if (!rc)
        break;
      ngon->N = N;
    }
    if (!rc)
      break;

    if ( minor_version >= 1 )
    {
      // chunk version 1.1 added face and vertex validation counts.
      rc = archive.ReadInt(&m_mesh_F_count);
      if (!rc)
        break;
      rc = archive.ReadInt(&m_mesh_V_count);
      if (!rc)
        break;
    }

    break;
  }
  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}